

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

StackSym * __thiscall StackSym::EnsureAuxSlotPtrSym(StackSym *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  SymID id;
  undefined4 *puVar3;
  ObjectSymInfo *pOVar4;
  StackSym *pSVar5;
  
  bVar2 = HasObjectInfo(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x3a7,"(HasObjectInfo())","HasObjectInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pOVar4 = GetObjectInfo(this);
  pSVar5 = pOVar4->m_auxSlotPtrSym;
  if (pSVar5 == (StackSym *)0x0) {
    id = SymTable::NewID(func->m_symTable);
    pSVar5 = New(id,TyVar,0xffffffff,func);
    pOVar4 = GetObjectInfo(this);
    pOVar4->m_auxSlotPtrSym = pSVar5;
  }
  return pSVar5;
}

Assistant:

StackSym *StackSym::EnsureAuxSlotPtrSym(Func * func)
{
    Assert(HasObjectInfo());
    StackSym * auxSlotPtrSym = GetObjectInfo()->m_auxSlotPtrSym;
    if (auxSlotPtrSym == nullptr)
    {
        auxSlotPtrSym = GetObjectInfo()->m_auxSlotPtrSym = StackSym::New(func);
    }
    return auxSlotPtrSym;
}